

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warning.cpp
# Opt level: O3

void processWarningFlag(char *flag)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  char *pcVar6;
  WarningState state;
  WarningState state_00;
  char *pcVar7;
  char **ppcVar8;
  byte bVar9;
  long lVar10;
  char *pcVar11;
  
  lVar10 = 0;
  ppcVar8 = warningFlags;
  do {
    iVar4 = strcmp(flag,*(char **)((long)warningFlags + lVar10 + 0xb0));
    if (iVar4 == 0) {
      if (processWarningFlag(char*)::setError != '\x01') {
        pbVar5 = *(byte **)((long)metaWarningCommands + lVar10);
        bVar9 = *pbVar5;
        while (bVar9 != 0x19) {
          pbVar5 = pbVar5 + 1;
          if (warningStates[bVar9] == WARNING_DEFAULT) {
            warningStates[bVar9] = WARNING_ENABLED;
          }
          bVar9 = *pbVar5;
        }
        return;
      }
      errx("Cannot make meta warning \"%s\" into an error",flag);
    }
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x18);
  iVar4 = strncmp(flag,"error",5);
  if (iVar4 == 0) {
    if (flag[5] == '=') {
      processWarningFlag(char*)::setError = 1;
      processWarningFlag(flag + 6);
      processWarningFlag(char*)::setError = 0;
      return;
    }
    if (flag[5] == '\0') {
      warningsAreErrors = true;
      return;
    }
  }
  state_00 = WARNING_ERROR;
  if ((((processWarningFlag(char*)::setError == '\0') && (state_00 = WARNING_ENABLED, *flag == 'n'))
      && (flag[1] == 'o')) && (flag[2] == '-')) {
    state_00 = WARNING_DISABLED;
    pcVar7 = flag + 3;
  }
  else {
    pcVar6 = strchr(flag,0x3d);
    pcVar7 = flag;
    if ((pcVar6 != (char *)0x0) && (cVar2 = pcVar6[1], cVar2 != '\0')) {
      pcVar11 = pcVar6 + 1;
      bVar3 = false;
      bVar9 = 0;
      do {
        if ((byte)(cVar2 - 0x3aU) < 0xf6) goto LAB_00115205;
        if ((byte)(0x2fU - cVar2) < bVar9) {
          bVar9 = 0xff;
          bVar1 = !bVar3;
          bVar3 = true;
          if (bVar1) {
            warnx("Invalid warning flag \"%s\": capping parameter at 255\n",flag);
          }
        }
        else {
          bVar9 = (bVar9 * '\n' + cVar2) - 0x30;
          pcVar11 = pcVar11 + 1;
        }
        cVar2 = *pcVar11;
      } while (cVar2 != '\0');
      if ((processWarningFlag(char*)::setError == '\x01') && (bVar9 == 0)) {
        pcVar7 = "Ignoring nonsensical warning flag \"%s\"\n";
        goto LAB_0011523d;
      }
      *pcVar6 = '\0';
      state = WARNING_DISABLED;
      if (bVar9 != 0) {
        state = state_00;
      }
      bVar3 = tryProcessParamWarning(flag,bVar9,state);
      if (bVar3) {
        return;
      }
    }
  }
LAB_00115205:
  lVar10 = 0;
  do {
    iVar4 = strcmp(pcVar7,*ppcVar8);
    if (iVar4 == 0) {
      *(WarningState *)((long)warningStates + lVar10) = state_00;
      return;
    }
    lVar10 = lVar10 + 4;
    ppcVar8 = ppcVar8 + 1;
  } while (lVar10 != 0x40);
  bVar3 = tryProcessParamWarning(pcVar7,'\0',state_00);
  if (bVar3) {
    return;
  }
  pcVar7 = "Unknown warning `%s`";
LAB_0011523d:
  warnx(pcVar7,flag);
  return;
}

Assistant:

void processWarningFlag(char *flag)
{
	static bool setError = false;

	// First, try to match against a "meta" warning
	for (enum WarningID id : EnumSeq(META_WARNINGS_START, NB_WARNINGS)) {
		// TODO: improve the matching performance?
		if (!strcmp(flag, warningFlags[id])) {
			// We got a match!
			if (setError)
				errx("Cannot make meta warning \"%s\" into an error",
				     flag);

			for (uint8_t const *ptr = metaWarningCommands[id - META_WARNINGS_START];
			     *ptr != META_WARNING_DONE; ptr++) {
				// Warning flag, set without override
				if (warningStates[*ptr] == WARNING_DEFAULT)
					warningStates[*ptr] = WARNING_ENABLED;
			}

			return;
		}
	}

	// If it's not a meta warning, specially check against `-Werror`
	if (!strncmp(flag, "error", strlen("error"))) {
		char *errorFlag = flag + strlen("error");

		switch (*errorFlag) {
		case '\0':
			// `-Werror`
			warningsAreErrors = true;
			return;

		case '=':
			// `-Werror=XXX`
			setError = true;
			processWarningFlag(errorFlag + 1); // Skip the `=`
			setError = false;
			return;

		// Otherwise, allow parsing as another flag
		}
	}

	// Well, it's either a normal warning or a mistake

	enum WarningState state = setError ? WARNING_ERROR :
				  // Not an error, then check if this is a negation
				  strncmp(flag, "no-", strlen("no-")) ? WARNING_ENABLED
								      : WARNING_DISABLED;
	char *rootFlag = state == WARNING_DISABLED ? flag + strlen("no-") : flag;

	// Is this a "parametric" warning?
	if (state != WARNING_DISABLED) { // The `no-` form cannot be parametrized
		// First, check if there is an "equals" sign followed by a decimal number
		char *equals = strchr(rootFlag, '=');

		if (equals && equals[1] != '\0') { // Ignore an equal sign at the very end as well
			// Is the rest of the string a decimal number?
			// We want to avoid `strtoul`'s whitespace and sign, so we parse manually
			uint8_t param = 0;
			char const *ptr = equals + 1;
			bool warned = false;

			// The `if`'s condition above ensures that this will run at least once
			do {
				// If we don't have a digit, bail
				if (*ptr < '0' || *ptr > '9')
					break;
				// Avoid overflowing!
				if (param > UINT8_MAX - (*ptr - '0')) {
					if (!warned)
						warnx("Invalid warning flag \"%s\": capping parameter at 255\n",
						      flag);
					warned = true; // Only warn once, cap always
					param = 255;
					continue;
				}
				param = param * 10 + (*ptr - '0');

				ptr++;
			} while (*ptr);

			// If we managed to the end of the string, check that the warning indeed
			// accepts a parameter
			if (*ptr == '\0') {
				if (setError && param == 0) {
					warnx("Ignoring nonsensical warning flag \"%s\"\n", flag);
					return;
				}
				*equals = '\0'; // Truncate the param at the '='
				if (tryProcessParamWarning(rootFlag, param,
							   param == 0 ? WARNING_DISABLED : state))
					return;
			}
		}
	}

	// Try to match the flag against a "normal" flag
	for (enum WarningID id : EnumSeq(NB_PLAIN_WARNINGS)) {
		if (!strcmp(rootFlag, warningFlags[id])) {
			// We got a match!
			warningStates[id] = state;
			return;
		}
	}

	// Lastly, this might be a "parametric" warning without an equals sign
	// If it is, treat the param as 1 if enabling, or 0 if disabling
	if (tryProcessParamWarning(rootFlag, 0, state))
		return;

	warnx("Unknown warning `%s`", flag);
}